

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O3

ssh_hash * keccak_new(ssh_hashalg *alg)

{
  void *pvVar1;
  
  pvVar1 = safemalloc(1,0x1d8,0);
  *(ssh_hashalg **)((long)pvVar1 + 0x1b0) = alg;
  *(code **)((long)pvVar1 + 0x1c0) = keccak_BinarySink_write;
  *(undefined8 *)((long)pvVar1 + 0x1c8) = 0;
  *(long *)((long)pvVar1 + 0x1d0) = (long)pvVar1 + 0x1c0;
  *(long *)((long)pvVar1 + 0x1b8) = (long)pvVar1 + 0x1c0;
  (*alg->reset)((ssh_hash *)((long)pvVar1 + 0x1b0));
  return (ssh_hash *)((long)pvVar1 + 0x1b0);
}

Assistant:

static ssh_hash *keccak_new(const ssh_hashalg *alg)
{
    struct keccak_hash *kh = snew(struct keccak_hash);
    kh->hash.vt = alg;
    BinarySink_INIT(kh, keccak_BinarySink_write);
    BinarySink_DELEGATE_INIT(&kh->hash, kh);
    return ssh_hash_reset(&kh->hash);
}